

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c003::TestCheckEqualsWithStringsWorksOnContentsConstConst::RunImpl
          (TestCheckEqualsWithStringsWorksOnContentsConstConst *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_90;
  int local_6c [5];
  TestDetails local_58;
  undefined1 local_38 [8];
  TestResults results;
  char *p2;
  char *p1;
  TestCheckEqualsWithStringsWorksOnContentsConstConst *this_local;
  
  results._16_8_ = (anonymous_namespace)::txt2;
  UnitTest::TestResults::TestResults((TestResults *)local_38,(TestReporter *)0x0);
  UnitTest::TestDetails::TestDetails(&local_58,"","","",0);
  UnitTest::CheckEqual
            ((TestResults *)local_38,(anonymous_namespace)::txt1,(anonymous_namespace)::txt2,
             &local_58);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_6c[1] = 0;
  local_6c[0] = UnitTest::TestResults::GetFailureCount((TestResults *)local_38);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_90,*ppTVar2,0x2c);
  UnitTest::CheckEqual<int,int>(results_00,local_6c + 1,local_6c,&local_90);
  return;
}

Assistant:

TEST(CheckEqualsWithStringsWorksOnContentsConstConst)
{
    char* const p1 = txt1;
    char* const p2 = txt2;
    TestResults results;
    CheckEqual(results, p1, p2, TestDetails("", "", "", 0));
    CHECK_EQUAL(0, results.GetFailureCount());
}